

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionArgumentInfo
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint uVar2;
  Op OVar3;
  char *pcVar4;
  long lVar5;
  DiagnosticStream local_200;
  
  lVar5 = (long)(inst->operands_).
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(inst->operands_).
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  OVar3 = ValidationState_t::GetIdOpcode(_,uVar2);
  if (OVar3 == OpString) {
    if ((ulong)(lVar5 >> 4) < 6) {
      return SPV_SUCCESS;
    }
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    OVar3 = ValidationState_t::GetIdOpcode(_,uVar2);
    if (OVar3 == OpString) {
      if (lVar5 == 0x60) {
        return SPV_SUCCESS;
      }
      uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,6);
      bVar1 = IsUint32Constant(_,uVar2);
      if (bVar1) {
        if ((ulong)(lVar5 >> 4) < 8) {
          return SPV_SUCCESS;
        }
        uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,7);
        bVar1 = IsUint32Constant(_,uVar2);
        if (bVar1) {
          if (lVar5 == 0x80) {
            return SPV_SUCCESS;
          }
          uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,8);
          bVar1 = IsUint32Constant(_,uVar2);
          if (bVar1) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
          pcVar4 = "TypeQualifier must be a 32-bit unsigned integer OpConstant";
          lVar5 = 0x3a;
        }
        else {
          ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
          pcVar4 = "AccessQualifier must be a 32-bit unsigned integer OpConstant";
          lVar5 = 0x3c;
        }
      }
      else {
        ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
        pcVar4 = "AddressQualifier must be a 32-bit unsigned integer OpConstant";
        lVar5 = 0x3d;
      }
    }
    else {
      ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
      pcVar4 = "TypeName must be an OpString";
      lVar5 = 0x1c;
    }
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    pcVar4 = "Name must be an OpString";
    lVar5 = 0x18;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar4,lVar5);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionArgumentInfo(ValidationState_t& _,
                                                 const Instruction* inst) {
  const auto num_operands = inst->operands().size();
  if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(4)) != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Name must be an OpString";
  }
  if (num_operands > 5) {
    if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(5)) != spv::Op::OpString) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "TypeName must be an OpString";
    }
  }
  if (num_operands > 6) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "AddressQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }
  if (num_operands > 7) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(7))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "AccessQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }
  if (num_operands > 8) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(8))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "TypeQualifier must be a 32-bit unsigned integer "
                "OpConstant";
    }
  }

  return SPV_SUCCESS;
}